

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChargeKineticCorrFunc.cpp
# Opt level: O0

int __thiscall
OpenMD::ChargeKineticCorrFunc::computeProperty2
          (ChargeKineticCorrFunc *this,int frame,StuntDouble *sd)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  bool bVar8;
  int iVar9;
  double *pdVar10;
  value_type_conflict *__x;
  reference this_00;
  size_type sVar11;
  StuntDouble *in_RDX;
  int in_ESI;
  long in_RDI;
  int k;
  int j;
  int i;
  Mat3x3d I;
  Vector3d angMom;
  Vector3d vel;
  RealType mass;
  RealType kinetic;
  SquareMatrix3<double> *in_stack_fffffffffffffd68;
  undefined4 in_stack_fffffffffffffd70;
  undefined4 in_stack_fffffffffffffd74;
  StuntDouble *in_stack_fffffffffffffd78;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffd80;
  undefined1 local_138 [116];
  uint local_c4;
  uint local_c0;
  int local_bc;
  RectMatrix<double,_3U,_3U> local_b8;
  Vector<double,_3U> local_70;
  Vector<double,_3U> local_58;
  double local_40;
  double local_20;
  StuntDouble *local_18;
  int local_c;
  
  local_20 = 0.0;
  local_18 = in_RDX;
  local_c = in_ESI;
  StuntDouble::getPos(in_stack_fffffffffffffd78);
  Vector3<double>::operator=
            ((Vector3<double> *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
             (Vector3<double> *)in_stack_fffffffffffffd68);
  local_40 = StuntDouble::getMass(local_18);
  StuntDouble::getVel(in_stack_fffffffffffffd78);
  dVar6 = local_40;
  pdVar10 = Vector<double,_3U>::operator[](&local_58,0);
  dVar1 = *pdVar10;
  pdVar10 = Vector<double,_3U>::operator[](&local_58,0);
  dVar2 = *pdVar10;
  pdVar10 = Vector<double,_3U>::operator[](&local_58,1);
  dVar3 = *pdVar10;
  pdVar10 = Vector<double,_3U>::operator[](&local_58,1);
  dVar4 = *pdVar10;
  pdVar10 = Vector<double,_3U>::operator[](&local_58,2);
  dVar5 = *pdVar10;
  pdVar10 = Vector<double,_3U>::operator[](&local_58,2);
  local_20 = dVar6 * (dVar5 * *pdVar10 + dVar1 * dVar2 + dVar3 * dVar4) + local_20;
  Vector3<double>::Vector3((Vector3<double> *)0x174802);
  SquareMatrix3<double>::SquareMatrix3((SquareMatrix3<double> *)0x17480f);
  bVar8 = StuntDouble::isDirectional
                    ((StuntDouble *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70));
  if (bVar8) {
    StuntDouble::getJ(in_stack_fffffffffffffd78);
    Vector3<double>::operator=
              ((Vector3<double> *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
               (Vector3<double> *)in_stack_fffffffffffffd68);
    (*local_18->_vptr_StuntDouble[5])(local_138);
    SquareMatrix3<double>::operator=
              ((SquareMatrix3<double> *)
               CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
               in_stack_fffffffffffffd68);
    SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x1748a2);
    bVar8 = StuntDouble::isLinear(local_18);
    if (bVar8) {
      local_bc = StuntDouble::linearAxis(local_18);
      local_c0 = local_bc + 1 + ((local_bc + 1) / 3) * -3;
      local_c4 = local_bc + 2 + ((local_bc + 2) / 3) * -3;
      pdVar10 = Vector<double,_3U>::operator[](&local_70,local_c0);
      dVar1 = *pdVar10;
      pdVar10 = Vector<double,_3U>::operator[](&local_70,local_c0);
      dVar2 = *pdVar10;
      pdVar10 = RectMatrix<double,_3U,_3U>::operator()(&local_b8,local_c0,local_c0);
      dVar3 = *pdVar10;
      pdVar10 = Vector<double,_3U>::operator[](&local_70,local_c4);
      dVar4 = *pdVar10;
      pdVar10 = Vector<double,_3U>::operator[](&local_70,local_c4);
      dVar5 = *pdVar10;
      pdVar10 = RectMatrix<double,_3U,_3U>::operator()(&local_b8,local_c4,local_c4);
      local_20 = (dVar1 * dVar2) / dVar3 + (dVar4 * dVar5) / *pdVar10 + local_20;
    }
    else {
      pdVar10 = Vector<double,_3U>::operator[](&local_70,0);
      dVar1 = *pdVar10;
      pdVar10 = Vector<double,_3U>::operator[](&local_70,0);
      dVar2 = *pdVar10;
      pdVar10 = RectMatrix<double,_3U,_3U>::operator()(&local_b8,0,0);
      dVar3 = *pdVar10;
      pdVar10 = Vector<double,_3U>::operator[](&local_70,1);
      dVar4 = *pdVar10;
      pdVar10 = Vector<double,_3U>::operator[](&local_70,1);
      dVar5 = *pdVar10;
      pdVar10 = RectMatrix<double,_3U,_3U>::operator()(&local_b8,1,1);
      dVar6 = *pdVar10;
      pdVar10 = Vector<double,_3U>::operator[](&local_70,2);
      dVar7 = *pdVar10;
      pdVar10 = Vector<double,_3U>::operator[](&local_70,2);
      in_stack_fffffffffffffd80 = (vector<double,_std::allocator<double>_> *)(dVar7 * *pdVar10);
      pdVar10 = RectMatrix<double,_3U,_3U>::operator()(&local_b8,2,2);
      local_20 = (dVar1 * dVar2) / dVar3 + (dVar4 * dVar5) / dVar6 +
                 (double)in_stack_fffffffffffffd80 / *pdVar10 + local_20;
    }
  }
  __x = (value_type_conflict *)(in_RDI + 0xec0);
  *(double *)(in_RDI + 0xec0) = local_20 * 0.5;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                *)(in_RDI + 0xe58),(long)local_c);
  std::vector<double,_std::allocator<double>_>::push_back(in_stack_fffffffffffffd80,__x);
  *(double *)(in_RDI + 0xea8) = *(double *)(in_RDI + 0xec0) + *(double *)(in_RDI + 0xea8);
  *(int *)(in_RDI + 0xebc) = *(int *)(in_RDI + 0xebc) + 1;
  this_00 = std::
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                          *)(in_RDI + 0xe58),(long)local_c);
  sVar11 = std::vector<double,_std::allocator<double>_>::size(this_00);
  iVar9 = (int)sVar11 + -1;
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x174daa);
  return iVar9;
}

Assistant:

int ChargeKineticCorrFunc::computeProperty2(int frame, StuntDouble* sd) {
    RealType kinetic(0.0);
    pos2_ = sd->getPos();

    RealType mass = sd->getMass();
    Vector3d vel  = sd->getVel();

    kinetic += mass * (vel[0] * vel[0] + vel[1] * vel[1] + vel[2] * vel[2]);

    Vector3d angMom;
    Mat3x3d I;
    int i, j, k;

    if (sd->isDirectional()) {
      angMom = sd->getJ();
      I      = sd->getI();

      if (sd->isLinear()) {
        i = sd->linearAxis();
        j = (i + 1) % 3;
        k = (i + 2) % 3;
        kinetic +=
            angMom[j] * angMom[j] / I(j, j) + angMom[k] * angMom[k] / I(k, k);
      } else {
        kinetic += angMom[0] * angMom[0] / I(0, 0) +
                   angMom[1] * angMom[1] / I(1, 1) +
                   angMom[2] * angMom[2] / I(2, 2);
      }
    }
    propertyTemp = 0.5 * kinetic;
    kinetic_[frame].push_back(propertyTemp);
    sumKinetic_ += propertyTemp;
    kineticCount_++;
    return kinetic_[frame].size() - 1;
  }